

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::~TransitionObservationIndependentMADPDiscrete
          (TransitionObservationIndependentMADPDiscrete *this,void **vtt)

{
  bool bVar1;
  reference ppMVar2;
  reference ppJVar3;
  vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *in_RSI;
  long *in_RDI;
  iterator last2;
  iterator it2;
  iterator last;
  iterator it;
  vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *in_stack_ffffffffffffff98;
  MultiAgentDecisionProcess *in_stack_ffffffffffffffa0;
  MultiAgentDecisionProcessDiscrete *in_stack_ffffffffffffffa8;
  __normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
  local_30;
  MultiAgentDecisionProcessDiscrete **local_28;
  MultiAgentDecisionProcessDiscrete **local_20;
  __normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
  local_18 [3];
  
  *in_RDI = (long)(((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)&in_RSI->
                        super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                   )->_M_impl).super__Vector_impl_data._M_start;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x40)) =
       (((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)&in_RSI[1].
             super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>)->
       _M_impl).super__Vector_impl_data._M_start;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x48)) =
       (((_Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)&in_RSI[1].
             super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>)->
       _M_impl).super__Vector_impl_data._M_finish;
  local_18[0]._M_current =
       (MultiAgentDecisionProcessDiscrete **)
       std::
       vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
       ::begin((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                *)in_stack_ffffffffffffff98);
  local_20 = (MultiAgentDecisionProcessDiscrete **)
             std::
             vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
             ::end((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                    *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffa8 = *ppMVar2;
    if (in_stack_ffffffffffffffa8 != (MultiAgentDecisionProcessDiscrete *)0x0) {
      (**(code **)(*(long *)&in_stack_ffffffffffffffa8->super_MultiAgentDecisionProcess + 8))();
    }
    local_28 = (MultiAgentDecisionProcessDiscrete **)
               __gnu_cxx::
               __normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
               ::operator++((__normal_iterator<MultiAgentDecisionProcessDiscrete_**,_std::vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>_>
                             *)in_stack_ffffffffffffffa8,
                            (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  std::
  vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
  ::clear((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
           *)0xab50d9);
  local_30._M_current =
       (JointActionDiscrete **)
       std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::begin
                 (in_stack_ffffffffffffff98);
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::end
            (in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppJVar3 = __gnu_cxx::
              __normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffffa0 = (MultiAgentDecisionProcess *)*ppJVar3;
    if (in_stack_ffffffffffffffa0 != (MultiAgentDecisionProcess *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffa0 + 8))();
    }
    __gnu_cxx::
    __normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
    ::operator++((__normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
                  *)in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::clear
            ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)0xab5161);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_RSI);
  std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::~vector
            ((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_> *)
             in_RSI);
  std::
  vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ::~vector((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
             *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::vector<State_*,_std::allocator<State_*>_>::~vector
            ((vector<State_*,_std::allocator<State_*>_> *)in_RSI);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_RSI);
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::~vector(in_RSI);
  std::
  vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
  ::~vector((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
             *)in_RSI);
  MultiAgentDecisionProcess::~MultiAgentDecisionProcess
            (in_stack_ffffffffffffffa0,(void **)in_stack_ffffffffffffff98);
  return;
}

Assistant:

TransitionObservationIndependentMADPDiscrete::
~TransitionObservationIndependentMADPDiscrete()
{
    // this destructor leaks memory

    vector<MultiAgentDecisionProcessDiscrete*>::iterator it = 
        _m_individualMADPDs.begin();
    vector<MultiAgentDecisionProcessDiscrete*>::iterator last = 
        _m_individualMADPDs.end();
    while(it != last)
    {
        delete *it;//pointer to MultiAgentDecisionProcessDiscrete
        it++;
    }
    _m_individualMADPDs.clear();
    
    vector<JointActionDiscrete*>::iterator it2 = 
        _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::iterator last2 = 
        _m_jointActionVec.end();
    while(it2 != last2)
    {
        delete *it2; //pointer to MultiAgentDecisionProcessDiscrete
        it2++;
    }
    _m_jointActionVec.clear();
}